

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O3

Boolean MA_pop_stack(Integer memhandle)

{
  AD *in_RAX;
  Boolean BVar1;
  AD *pAVar2;
  AD *pAVar3;
  _AD **pp_Var4;
  AD *ad;
  AD *local_28;
  
  ma_stats.calls[0x14] = ma_stats.calls[0x14] + 1;
  local_28 = in_RAX;
  BVar1 = mh2ad(memhandle,&local_28,BL_StackTop,"MA_pop_stack");
  if (BVar1 == 0) {
    BVar1 = 0;
  }
  else {
    if (ma_trace != 0) {
      printf("MA: popping \'%s\'\n",local_28->name);
    }
    if (ma_sused == (AD *)0x0) {
LAB_0016bac2:
      pAVar2 = (AD *)0x0;
    }
    else {
      pAVar2 = ma_sused;
      if (ma_sused == local_28) {
        pAVar3 = (AD *)0x0;
      }
      else {
        do {
          pAVar3 = pAVar2;
          pAVar2 = pAVar3->next;
          if (pAVar2 == (AD *)0x0) goto LAB_0016bac2;
        } while (pAVar2 != local_28);
      }
      pp_Var4 = &ma_sused;
      if (pAVar3 != (AD *)0x0) {
        pp_Var4 = &pAVar3->next;
      }
      *pp_Var4 = pAVar2->next;
    }
    if (pAVar2 == local_28) {
      ma_sp = ma_sp + local_28->nbytes;
      ma_stats.sblocks = ma_stats.sblocks - 1;
      ma_stats.sbytes = ma_stats.sbytes - local_28->nbytes;
      ma_table_deallocate(memhandle);
      BVar1 = 1;
    }
    else {
      BVar1 = 0;
      sprintf(ma_ebuf,"memhandle %ld (name: \'%s\') not on stack used list",memhandle,local_28->name
             );
      ma_error(EL_Nonfatal,ET_Internal,"MA_pop_stack",ma_ebuf);
    }
  }
  return BVar1;
}

Assistant:

public Boolean MA_pop_stack(Integer memhandle) /* the block to deallocate */
{
    AD        *ad;        /* AD for memhandle */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_pop_stack]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_StackTop, "MA_pop_stack"))
        return MA_FALSE;

    if (ma_trace) 
    (void)printf("MA: popping '%s'\n", ad->name);

    /* delete block from used list */
    if (list_delete(ad, &ma_sused) != ad)
    {
        (void)sprintf(ma_ebuf,
            "memhandle %ld (name: '%s') not on stack used list",
            (size_t)memhandle, ad->name);
        ma_error(EL_Nonfatal, ET_Internal, "MA_pop_stack", ma_ebuf);
        return MA_FALSE;
    }

    /* pop block from stack */
    ma_sp += ad->nbytes;

#ifdef STATS
    ma_stats.sblocks--;
    ma_stats.sbytes -= ad->nbytes;
#endif /* STATS */

    /* free memhandle */
    ma_table_deallocate(memhandle);

    /* success */
    return MA_TRUE;
}